

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

_outconnect * obj_connect(t_object *source,int outno,t_object *sink,int inno)

{
  t_pd *pp_Var1;
  _outconnect *p_Var2;
  _outconnect *p_Var3;
  _outconnect *p_Var4;
  int iVar5;
  _outconnect *p_Var6;
  _outlet *p_Var7;
  bool bVar8;
  bool bVar9;
  
  p_Var7 = source->te_outlet;
  bVar9 = p_Var7 != (_outlet *)0x0;
  if (outno != 0 && bVar9) {
    iVar5 = outno + -1;
    do {
      p_Var7 = p_Var7->o_next;
      bVar8 = iVar5 != 0;
      iVar5 = iVar5 + -1;
      bVar9 = p_Var7 != (_outlet *)0x0;
      if (p_Var7 == (_outlet *)0x0) break;
    } while (bVar8);
  }
  if (bVar9) {
    if (((sink->te_g).g_pd)->c_firstin == '\0') {
LAB_0016e480:
      sink = (t_object *)sink->te_inlet;
      bVar9 = sink != (t_object *)0x0;
      if (inno != 0 && bVar9) {
        do {
          inno = inno + -1;
          sink = (t_object *)((t_pd)sink)->c_helpname;
          bVar9 = (t_pd)sink != (t_pd)0x0;
          if ((t_pd)sink == (t_pd)0x0) break;
        } while (inno != 0);
      }
      if (!bVar9) goto LAB_0016e501;
    }
    else if (inno != 0) {
      inno = inno + -1;
      goto LAB_0016e480;
    }
    p_Var6 = (_outconnect *)&p_Var7->o_connections;
    if ((p_Var7->o_connections != (_outconnect *)0x0) &&
       (pp_Var1 = p_Var7->o_connections->oc_to, *pp_Var1 == backtracer_class)) {
      p_Var6 = (_outconnect *)(pp_Var1 + 1);
    }
    p_Var3 = (_outconnect *)getbytes(0x10);
    p_Var3->oc_next = (_outconnect *)0x0;
    p_Var3->oc_to = (t_pd *)sink;
    p_Var2 = p_Var6->oc_next;
    while (p_Var4 = p_Var2, p_Var4 != (_outconnect *)0x0) {
      p_Var6 = p_Var4;
      p_Var2 = p_Var4->oc_next;
    }
    p_Var6->oc_next = p_Var3;
    if (p_Var7->o_sym == &s_signal) {
      canvas_update_dsp();
    }
  }
  else {
LAB_0016e501:
    p_Var3 = (_outconnect *)0x0;
  }
  return p_Var3;
}

Assistant:

t_outconnect *obj_connect(t_object *source, int outno,
    t_object *sink, int inno)
{
    t_inlet *i;
    t_outlet *o;
    t_pd *to;
    t_outconnect *oc, *oc2, **ochead;

    for (o = source->ob_outlet; o && outno; o = o->o_next, outno--) ;
    if (!o) return (0);

    if (sink->ob_pd->c_firstin)
    {
        if (!inno)
        {
            to = &sink->ob_pd;
            goto doit;
        }
        else inno--;
    }
    for (i = sink->ob_inlet; i && inno; i = i->i_next, inno--) ;
    if (!i) return (0);
    to = &i->i_pd;
doit:
    ochead = outlet_getconnectionpointer(o);
    oc = (t_outconnect *)t_getbytes(sizeof(*oc));
    oc->oc_next = 0;
    oc->oc_to = to;
        /* append it to the end of the list */
        /* LATER we might cache the last "oc" to make this faster. */
    if ((oc2 = *ochead))
    {
        while (oc2->oc_next)
            oc2 = oc2->oc_next;
        oc2->oc_next = oc;
    }
    else *ochead = oc;
    if (o->o_sym == &s_signal) canvas_update_dsp();

    return (oc);
}